

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O3

bool __thiscall
ObjectModelBuilder::buildObject(ObjectModelBuilder *this,value *value,Object *parent,Class *clazz)

{
  pointer *pppOVar1;
  string *this_00;
  pointer pPVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  value *pvVar4;
  pointer pvVar5;
  array *paVar6;
  pointer pvVar7;
  iterator __position;
  undefined8 this_02;
  _storage _Var8;
  bool bVar9;
  int iVar10;
  Object *pOVar11;
  _Rb_tree_header *p_Var12;
  iterator iVar13;
  mapped_type *pmVar14;
  _Base_ptr p_Var15;
  const_iterator cVar16;
  string *psVar17;
  string *psVar18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var19;
  const_iterator cVar20;
  array *paVar21;
  Class *this_03;
  ostream *poVar22;
  Class *clazz_00;
  pointer pPVar23;
  void *pvVar24;
  value *x;
  ObjectModelBuilder *this_04;
  ObjectModelBuilder *pOVar25;
  int iVar26;
  pointer pvVar27;
  bool bVar28;
  undefined1 local_110 [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
  member;
  shared_ptr<Binding> binding;
  string typeName;
  string id;
  Object *local_80;
  Object *instance;
  Property classProperty;
  
  if (value->type_ != 5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"error: \'root\' entry in class=\'",0x1e);
    poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(clazz->name)._M_dataplus._M_p,
                         (clazz->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar22,"\' is not a JSON object...",0x19);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar22 + -0x18) + (char)poVar22);
    std::ostream::put((char)poVar22);
    std::ostream::flush();
    return false;
  }
  this_00 = (value->u_).string_;
  findStringInObject((string *)
                     &binding.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     (object *)this_00,"class");
  if (typeName._M_dataplus._M_p == (pointer)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"error: object has empty or missing \'class\' in class=\'",0x35
              );
    poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(clazz->name)._M_dataplus._M_p,
                         (clazz->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar22,"\', ",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar22 + -0x18) + (char)poVar22);
    std::ostream::put((char)poVar22);
    std::ostream::flush();
    bVar9 = false;
    goto LAB_0010f0d0;
  }
  findStringInObject((string *)&instance,(object *)this_00,"id");
  uniqueIdentifier((string *)((long)&typeName.field_2 + 8),this,clazz_00,(string *)&instance);
  if (instance != (Object *)&classProperty.name) {
    operator_delete(instance);
  }
  pOVar11 = (Object *)operator_new(0x78);
  (pOVar11->id)._M_dataplus._M_p = (pointer)0x0;
  (pOVar11->id)._M_string_length = 0;
  (pOVar11->id).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(pOVar11->id).field_2 + 8) = 0;
  *(undefined8 *)&(pOVar11->propertyValues)._M_t._M_impl = 0;
  *(undefined8 *)&(pOVar11->propertyValues)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  pOVar11->clazz = (Class *)0x0;
  pOVar11->parent = (Object *)0x0;
  (pOVar11->id)._M_dataplus._M_p = (pointer)&(pOVar11->id).field_2;
  (pOVar11->id).field_2._M_local_buf[0] = '\0';
  p_Var12 = &(pOVar11->propertyValues)._M_t._M_impl.super__Rb_tree_header;
  (pOVar11->propertyValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pOVar11->propertyValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var12->_M_header;
  (pOVar11->propertyValues)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var12->_M_header;
  (pOVar11->propertyValues)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (pOVar11->children).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pOVar11->children).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pOVar11->children).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pOVar11->parent = parent;
  local_80 = pOVar11;
  std::__cxx11::string::_M_assign((string *)&pOVar11->id);
  iVar13 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
           ::find(&(this->m_classes)._M_t,
                  (key_type *)
                  &binding.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if ((_Rb_tree_header *)iVar13._M_node == &(this->m_classes)._M_t._M_impl.super__Rb_tree_header) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"error: unknown class=",0x15);
    poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         (char *)binding.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi,(long)typeName._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar22,", for object id=",0x10);
    poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar22,(char *)typeName.field_2._8_8_,(long)id._M_dataplus._M_p);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar22 + -0x18) + (char)poVar22);
    std::ostream::put((char)poVar22);
    std::ostream::flush();
    goto LAB_0010f0b9;
  }
  pOVar11->clazz = *(Class **)(iVar13._M_node + 2);
  for (p_Var15 = *(_Base_ptr *)((long)&this_00->field_2 + 8);
      (_Rb_tree_header *)p_Var15 != (_Rb_tree_header *)&this_00->_M_string_length;
      p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15)) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
            *)local_110,
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>
            *)(p_Var15 + 1));
    iVar10 = std::__cxx11::string::compare((char *)local_110);
    iVar26 = 3;
    if (((iVar10 != 0) && (iVar10 = std::__cxx11::string::compare((char *)local_110), iVar10 != 0))
       && (iVar10 = std::__cxx11::string::compare((char *)local_110), iVar10 != 0)) {
      id.field_2._8_8_ = local_80;
      pPVar23 = (local_80->clazz->properties).
                super__Vector_base<Property,_std::allocator<Property>_>._M_impl.
                super__Vector_impl_data._M_start;
      pPVar2 = (local_80->clazz->properties).super__Vector_base<Property,_std::allocator<Property>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pPVar23 != pPVar2) {
        bVar9 = false;
        do {
          instance = (Object *)pPVar23->clazz;
          classProperty.clazz = (Class *)&classProperty.name._M_string_length;
          pcVar3 = (pPVar23->name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&classProperty,pcVar3,pcVar3 + (pPVar23->name)._M_string_length);
          classProperty.name.field_2._8_8_ = &classProperty.type._M_string_length;
          pcVar3 = (pPVar23->type)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)((long)&classProperty.name.field_2 + 8),pcVar3,
                     pcVar3 + (pPVar23->type)._M_string_length);
          pcVar3 = (pointer)CONCAT71(classProperty.name._M_dataplus._M_p._1_7_,
                                     classProperty.name._M_dataplus._M_p._0_1_);
          if (pcVar3 == member.first._M_dataplus._M_p) {
            if (pcVar3 == (pointer)0x0) {
              bVar28 = true;
              bVar9 = true;
            }
            else {
              iVar10 = bcmp(classProperty.clazz,(void *)local_110,(size_t)pcVar3);
              bVar28 = iVar10 == 0;
              bVar9 = (bool)(bVar9 | bVar28);
            }
          }
          else {
            bVar28 = false;
          }
          if ((size_type *)classProperty.name.field_2._8_8_ != &classProperty.type._M_string_length)
          {
            operator_delete((void *)classProperty.name.field_2._8_8_);
          }
          if (classProperty.clazz != (Class *)&classProperty.name._M_string_length) {
            operator_delete(classProperty.clazz);
          }
          this_02 = member.second._0_8_;
          pPVar23 = pPVar23 + 1;
        } while (!bVar28 && pPVar23 != pPVar2);
        if (bVar9) {
          if (member.first.field_2._8_4_ == 5) {
            psVar18 = &classProperty.name;
            instance = (Object *)psVar18;
            std::__cxx11::string::_M_construct<char_const*>((string *)&instance,"bind","");
            cVar20 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                             *)this_02,(key_type *)&instance);
            if (instance != (Object *)psVar18) {
              operator_delete(instance);
            }
            instance = (Object *)psVar18;
            std::__cxx11::string::_M_construct<char_const*>((string *)&instance,"to","");
            cVar16 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                             *)this_02,(key_type *)&instance);
            if (instance != (Object *)psVar18) {
              operator_delete(instance);
            }
            if (((cVar20._M_node == (_Base_ptr)(this_02 + 8)) ||
                (cVar16._M_node == (_Base_ptr)(this_02 + 8) || cVar20._M_node[2]._M_color != 3)) ||
               (1 < cVar16._M_node[2]._M_color - 3)) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"error: malformed binding in object id=",0x26);
              poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,(char *)typeName.field_2._8_8_,
                                   (long)id._M_dataplus._M_p);
              std::__ostream_insert<char,std::char_traits<char>>(poVar22,", class=",8);
              poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar22,(char *)binding.
                                                  super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi,(long)typeName._M_dataplus._M_p
                                  );
              std::__ostream_insert<char,std::char_traits<char>>(poVar22,", property=",0xb);
              poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar22,(char *)local_110,(long)member.first._M_dataplus._M_p);
              iVar26 = 1;
              std::endl<char,std::char_traits<char>>(poVar22);
              goto LAB_0010e585;
            }
            member.second.u_.string_ = (string *)operator_new(0x38);
            (((string *)
             &(member.second.u_.array_)->
              super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)->field_2).
            _M_allocated_capacity = 0;
            *(undefined8 *)((long)&(member.second.u_.string_)->field_2 + 8) = 0;
            (((string *)
             &(member.second.u_.array_)->
              super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)->_M_dataplus).
            _M_p = (pointer)&(member.second.u_.string_)->field_2;
            (member.second.u_.string_)->_M_string_length = 0;
            ((member.second.u_.object_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
                 (_Base_ptr)0x0;
            ((member.second.u_.object_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
            member.second.u_.string_[1].field_2._M_allocated_capacity = 0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Binding*>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&binding,
                       (Binding *)member.second.u_.string_);
            _Var8 = member.second.u_;
            pOVar25 = (ObjectModelBuilder *)(cVar16._M_node + 2);
            if (*(_Rb_tree_color *)&(pOVar25->m_ids)._M_t._M_impl == 3) {
              this_04 = pOVar25;
              psVar17 = picojson::value::get<std::__cxx11::string>((value *)pOVar25);
              bVar9 = buildBindingDependency(this_04,_Var8,psVar17,(Object *)id.field_2._8_8_,clazz)
              ;
              if (bVar9) goto LAB_0010e9ab;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"error: malformed binding dependency=",0x24);
              psVar18 = picojson::value::get<std::__cxx11::string>((value *)pOVar25);
              poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,(psVar18->_M_dataplus)._M_p,
                                   psVar18->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar22,", in object id=",0xf);
              poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar22,(char *)typeName.field_2._8_8_,(long)id._M_dataplus._M_p)
              ;
              std::__ostream_insert<char,std::char_traits<char>>(poVar22,", class=",8);
              poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar22,(char *)binding.
                                                  super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi,(long)typeName._M_dataplus._M_p
                                  );
              std::__ostream_insert<char,std::char_traits<char>>(poVar22,", property=",0xb);
              poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar22,(char *)local_110,(long)member.first._M_dataplus._M_p);
              std::endl<char,std::char_traits<char>>(poVar22);
LAB_0010eb86:
              bVar9 = false;
            }
            else {
              paVar21 = picojson::value::
                        get<std::vector<picojson::value,std::allocator<picojson::value>>>
                                  ((value *)pOVar25);
              pvVar4 = (paVar21->
                       super__Vector_base<picojson::value,_std::allocator<picojson::value>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
              for (x = (paVar21->
                       super__Vector_base<picojson::value,_std::allocator<picojson::value>_>).
                       _M_impl.super__Vector_impl_data._M_start; x != pvVar4; x = x + 1) {
                picojson::value::value((value *)&instance,x);
                _Var8 = member.second.u_;
                if ((int)instance != 3) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,
                             "error: binding dependency needs to be a JSON string, id=",0x38);
                  poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cerr,(char *)typeName.field_2._8_8_,
                                       (long)id._M_dataplus._M_p);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar22,", property=",0xb);
                  poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar22,(char *)local_110,(long)member.first._M_dataplus._M_p
                                      );
                  std::__ostream_insert<char,std::char_traits<char>>(poVar22,", class=",8);
                  p_Var19 = &binding.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount;
LAB_0010eb67:
                  poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar22,(char *)p_Var19->_M_pi,*(long *)(p_Var19 + 1));
                  std::endl<char,std::char_traits<char>>(poVar22);
                  picojson::value::~value((value *)&instance);
                  goto LAB_0010eb86;
                }
                pOVar25 = (ObjectModelBuilder *)&instance;
                psVar17 = picojson::value::get<std::__cxx11::string>((value *)pOVar25);
                bVar9 = buildBindingDependency
                                  (pOVar25,_Var8,psVar17,(Object *)id.field_2._8_8_,clazz);
                if (!bVar9) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"error: malformed binding dependency=",0x24);
                  p_Var19 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_110;
                  psVar18 = picojson::value::get<std::__cxx11::string>((value *)&instance);
                  poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cerr,(psVar18->_M_dataplus)._M_p,
                                       psVar18->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar22,", in object id=",0xf);
                  poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar22,(char *)typeName.field_2._8_8_,
                                       (long)id._M_dataplus._M_p);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar22,", class=",8);
                  poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar22,(char *)binding.
                                                  super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi,(long)typeName._M_dataplus._M_p
                                      );
                  std::__ostream_insert<char,std::char_traits<char>>(poVar22,", property=",0xb);
                  goto LAB_0010eb67;
                }
                picojson::value::~value((value *)&instance);
              }
LAB_0010e9ab:
              picojson::value::get<std::__cxx11::string>((value *)(cVar20._M_node + 2));
              std::__cxx11::string::_M_assign((string *)member.second.u_.string_);
              classProperty.clazz = (Class *)0x0;
              classProperty.name._M_dataplus._M_p._0_1_ = 0;
              classProperty.type._M_dataplus._M_p = (pointer)0x0;
              classProperty.type._M_string_length._0_4_ = 3;
              classProperty.name.field_2._8_8_ = member.second.u_;
              instance = (Object *)psVar18;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&classProperty.type,
                         (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&binding);
              pmVar14 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value>_>_>
                                      *)(id.field_2._8_8_ + 0x30),(key_type *)local_110);
              Value::operator=(pmVar14,(Value *)&instance);
              Value::~Value((Value *)&instance);
              bVar9 = true;
            }
            if (binding.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         binding.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
            }
            iVar26 = 1;
            if (!bVar9) goto LAB_0010e585;
          }
          else {
            if (member.first.field_2._8_4_ == 3) {
              Value::string((Value *)&instance,(string *)member.second._0_8_);
              pmVar14 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value>_>_>
                                      *)(id.field_2._8_8_ + 0x30),(key_type *)local_110);
              std::__cxx11::string::operator=((string *)pmVar14,(string *)&instance);
              pmVar14->numberValue = (double)classProperty.name.field_2._M_allocated_capacity;
              this_01 = (pmVar14->bindingValue).
                        super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
              (pmVar14->bindingValue).super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (element_type *)classProperty.name.field_2._8_8_;
              (pmVar14->bindingValue).super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   classProperty.type._M_dataplus._M_p;
            }
            else {
              if (member.first.field_2._8_4_ != 2) goto LAB_0010e4c1;
              instance = (Object *)&classProperty.name;
              classProperty.clazz = (Class *)0x0;
              classProperty.name._M_dataplus._M_p._0_1_ = 0;
              classProperty.name.field_2._8_8_ = 0;
              classProperty.type._M_dataplus._M_p = (pointer)0x0;
              classProperty.type._M_string_length._0_4_ = 1;
              classProperty.name.field_2._M_allocated_capacity = member.second._0_8_;
              pmVar14 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Value>_>_>
                                      *)(id.field_2._8_8_ + 0x30),(key_type *)local_110);
              std::__cxx11::string::operator=((string *)pmVar14,(string *)&instance);
              pmVar14->numberValue = (double)classProperty.name.field_2._M_allocated_capacity;
              this_01 = (pmVar14->bindingValue).
                        super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
              (pmVar14->bindingValue).super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   = (element_type *)classProperty.name.field_2._8_8_;
              (pmVar14->bindingValue).super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   classProperty.type._M_dataplus._M_p;
            }
            classProperty.type._M_dataplus._M_p = (pointer)0x0;
            classProperty.name.field_2._8_8_ = 0;
            if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              classProperty.type._M_dataplus._M_p = (pointer)0x0;
              classProperty.name.field_2._8_8_ = 0;
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
            }
            pmVar14->type = (uint)classProperty.type._M_string_length;
            if (classProperty.type._M_dataplus._M_p != (pointer)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         classProperty.type._M_dataplus._M_p);
            }
            if (instance != (Object *)&classProperty.name) {
              operator_delete(instance);
            }
          }
LAB_0010e4c1:
          iVar26 = 0;
          goto LAB_0010e585;
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"error: object id=",0x11);
      poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,(char *)typeName.field_2._8_8_,
                           (long)id._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar22,", class=",8);
      poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar22,(char *)binding.
                                           super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>.
                                           _M_refcount._M_pi,(long)typeName._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar22,", unknown property=",0x13);
      poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar22,(char *)local_110,(long)member.first._M_dataplus._M_p);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar22 + -0x18) + (char)poVar22);
      std::ostream::put((char)poVar22);
      iVar26 = 1;
      std::ostream::flush();
    }
LAB_0010e585:
    pvVar24 = (void *)member.second._0_8_;
    if (member.first.field_2._8_4_ == 5) {
      if (member.second._0_8_ == 0) {
LAB_0010e5e5:
        pvVar24 = (void *)0x0;
      }
      else {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                     *)member.second._0_8_);
      }
LAB_0010e5e7:
      operator_delete(pvVar24);
    }
    else {
      if (member.first.field_2._8_4_ == 4) {
        if (member.second._0_8_ == 0) goto LAB_0010e5e5;
        std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
                  ((vector<picojson::value,_std::allocator<picojson::value>_> *)member.second._0_8_)
        ;
        goto LAB_0010e5e7;
      }
      if (member.first.field_2._8_4_ == 3) {
        if (member.second._0_8_ == 0) goto LAB_0010e5e5;
        if (*(void **)member.second._0_8_ != (void *)(member.second._0_8_ + 0x10)) {
          operator_delete(*(void **)member.second._0_8_);
        }
        goto LAB_0010e5e7;
      }
    }
    if (local_110 != (undefined1  [8])&member.first._M_string_length) {
      operator_delete((void *)local_110);
    }
    if ((iVar26 != 3) && (iVar26 != 0)) goto LAB_0010f0b9;
  }
  instance = (Object *)&classProperty.name;
  std::__cxx11::string::_M_construct<char_const*>((string *)&instance,"children","");
  cVar20 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                   *)this_00,(key_type *)&instance);
  if (instance != (Object *)&classProperty.name) {
    operator_delete(instance);
  }
  if ((_Rb_tree_header *)cVar20._M_node == (_Rb_tree_header *)&this_00->_M_string_length) {
LAB_0010eebc:
    if (this->m_verbose == true) {
      instance = (Object *)&classProperty.name;
      classProperty.clazz = (Class *)0x0;
      classProperty.name._M_dataplus._M_p._0_1_ = 0;
      if (parent != (Object *)0x0) {
        pOVar11 = parent;
        do {
          std::__cxx11::string::append((char *)&instance);
          pOVar11 = pOVar11->parent;
        } while (pOVar11 != (Object *)0x0);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," - object: ",0xb);
      poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,(char *)instance,(long)classProperty.clazz);
      std::__ostream_insert<char,std::char_traits<char>>(poVar22,"id=",3);
      poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar22,(char *)typeName.field_2._8_8_,(long)id._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar22,", class=",8);
      poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar22,(char *)binding.
                                           super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>.
                                           _M_refcount._M_pi,(long)typeName._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar22,", children=",0xb);
      poVar22 = std::ostream::_M_insert<unsigned_long>((ulong)poVar22);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar22 + -0x18) + (char)poVar22);
      std::ostream::put((char)poVar22);
      std::ostream::flush();
      if (instance != (Object *)&classProperty.name) {
        operator_delete(instance);
      }
    }
    if (parent == (Object *)0x0) {
      clazz->root = local_80;
    }
    else {
      __position._M_current =
           (parent->children).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (parent->children).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        bVar9 = true;
        std::vector<Object*,std::allocator<Object*>>::_M_realloc_insert<Object*const&>
                  ((vector<Object*,std::allocator<Object*>> *)&parent->children,__position,&local_80
                  );
        goto LAB_0010f0bb;
      }
      *__position._M_current = local_80;
      pppOVar1 = &(parent->children).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl
                  .super__Vector_impl_data._M_finish;
      *pppOVar1 = *pppOVar1 + 1;
    }
    bVar9 = true;
  }
  else {
    if (cVar20._M_node[2]._M_color == 5) {
      bVar9 = buildObject(this,(value *)(cVar20._M_node + 2),local_80,clazz);
      if (bVar9) goto LAB_0010eebc;
    }
    else {
      if (cVar20._M_node[2]._M_color == 4) {
        paVar21 = picojson::value::get<std::vector<picojson::value,std::allocator<picojson::value>>>
                            ((value *)(cVar20._M_node + 2));
        pvVar5 = (paVar21->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pvVar27 = (paVar21->
                       super__Vector_base<picojson::value,_std::allocator<picojson::value>_>).
                       _M_impl.super__Vector_impl_data._M_start; pvVar27 != pvVar5;
            pvVar27 = pvVar27 + 1) {
          iVar10 = pvVar27->type_;
          instance = (Object *)CONCAT44(instance._4_4_,iVar10);
          if (iVar10 == 5) {
            this_03 = (Class *)operator_new(0x30);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
            ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                        *)this_03,
                       (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                        *)(pvVar27->u_).string_);
          }
          else if (iVar10 == 4) {
            this_03 = (Class *)operator_new(0x18);
            std::vector<picojson::value,_std::allocator<picojson::value>_>::vector
                      ((vector<picojson::value,_std::allocator<picojson::value>_> *)this_03,
                       (vector<picojson::value,_std::allocator<picojson::value>_> *)
                       (pvVar27->u_).string_);
          }
          else if (iVar10 == 3) {
            this_03 = (Class *)operator_new(0x20);
            paVar6 = (pvVar27->u_).array_;
            (this_03->name)._M_dataplus._M_p = (pointer)&(this_03->name).field_2;
            pvVar7 = (paVar6->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)
                     ._M_impl.super__Vector_impl_data._M_start;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)this_03,pvVar7,
                       (long)&((paVar6->
                               super__Vector_base<picojson::value,_std::allocator<picojson::value>_>
                               )._M_impl.super__Vector_impl_data._M_finish)->type_ + (long)pvVar7);
          }
          else {
            this_03 = (Class *)(pvVar27->u_).array_;
          }
          classProperty.clazz = this_03;
          bVar9 = buildObject(this,(value *)&instance,local_80,clazz);
          if (iVar10 == 5) {
            if (this_03 == (Class *)0x0) {
LAB_0010edf2:
              this_03 = (Class *)0x0;
            }
            else {
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                           *)this_03);
            }
LAB_0010edf5:
            operator_delete(this_03);
          }
          else {
            if (iVar10 == 4) {
              if (this_03 == (Class *)0x0) goto LAB_0010edf2;
              std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
                        ((vector<picojson::value,_std::allocator<picojson::value>_> *)this_03);
              goto LAB_0010edf5;
            }
            if (iVar10 == 3) {
              if (this_03 == (Class *)0x0) goto LAB_0010edf2;
              pcVar3 = (this_03->name)._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar3 != &(this_03->name).field_2) {
                operator_delete(pcVar3);
              }
              goto LAB_0010edf5;
            }
          }
          if (!bVar9) goto LAB_0010f0b9;
        }
        goto LAB_0010eebc;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"error: object id=",0x11);
      poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,(char *)typeName.field_2._8_8_,
                           (long)id._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar22," of class=",10);
      poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar22,(char *)binding.
                                           super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>.
                                           _M_refcount._M_pi,(long)typeName._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar22,", has invalid children, must be JSON array or object",0x34);
      std::endl<char,std::char_traits<char>>(poVar22);
    }
LAB_0010f0b9:
    bVar9 = false;
  }
LAB_0010f0bb:
  if ((size_type *)typeName.field_2._8_8_ != &id._M_string_length) {
    operator_delete((void *)typeName.field_2._8_8_);
  }
LAB_0010f0d0:
  if (binding.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&typeName._M_string_length) {
    operator_delete(binding.super___shared_ptr<Binding,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi);
  }
  return bVar9;
}

Assistant:

bool ObjectModelBuilder::buildObject(const picojson::value &value, Object *parent, Class *clazz)
{
    if (!value.is<picojson::object>()) {
        std::cerr << "error: 'root' entry in class='" << clazz->name << "' is not a JSON object..." << std::endl;
        return false;
    }

    const picojson::object &object = value.get<picojson::object>();

    std::string typeName = findStringInObject(object, "class");
    if (typeName.empty()) {
        std::cerr << "error: object has empty or missing 'class' in class='" << clazz->name << "', " << std::endl;
        return false;
    }

    std::string id = uniqueIdentifier(clazz, (findStringInObject(object, "id")));

    Object *instance = new Object();
    instance->parent = parent;
    instance->id = id;

    auto classIt = m_classes.find(typeName);
    if (classIt == m_classes.end()) {
        std::cerr << "error: unknown class=" << typeName << ", for object id=" << id << std::endl;
        return false;
    }
    instance->clazz = classIt->second;

    // Parse out the properties and values..
    for (auto member : object) {
        const std::string &key = member.first;

        // These are special cased above and below
        if (key == "children" || key == "id" || key == "class")
            continue;

        // Verify that the class in question actually has the property
        bool exists = false;
        for (auto classProperty : instance->clazz->properties) {
            if (classProperty.name == key) {
                exists = true;
                break;
            }
        }
        if (!exists) {
            std::cerr << "error: object id=" << id << ", class=" << typeName << ", unknown property=" << key << std::endl;
            return false;
        }

        const picojson::value &propertyValue = member.second;
        if (propertyValue.is<double>()) {
            instance->propertyValues[key] = Value::number(propertyValue.get<double>());
        } else if (propertyValue.is<std::string>()) {
            instance->propertyValues[key] = Value::string(propertyValue.get<std::string>());
        } else if (propertyValue.is<picojson::object>()) {
            const picojson::object &binding = propertyValue.get<picojson::object>();
            auto bind = binding.find("bind");
            auto to = binding.find("to");

            if (bind != binding.end() && bind->second.is<std::string>()
                && to != binding.end() && (to->second.is<std::string>() || to->second.is<picojson::array>())) {
                std::shared_ptr<Binding> binding(new Binding());
                if (to->second.is<std::string>()) {
                    if (!buildBindingDependency(binding.get(), to->second.get<std::string>(), instance, clazz)) {
                        std::cerr << "error: malformed binding dependency=" << to->second.get<std::string>() << ", in object id="
                                  << id << ", class=" << typeName << ", property=" << key << std::endl;
                        return false;
                    }
                } else {
                    for (auto i : to->second.get<picojson::array>()) {
                        if (!i.is<std::string>()) {
                            std::cerr << "error: binding dependency needs to be a JSON string, id=" << id << ", property="
                                      << key << ", class=" << typeName << std::endl;
                            return false;
                        }
                        if (!buildBindingDependency(binding.get(), i.get<std::string>(), instance, clazz)) {
                            std::cerr << "error: malformed binding dependency=" << i.get<std::string>() << ", in object id="
                                      << id << ", class=" << typeName << ", property=" << key << std::endl;
                            return false;
                        }
                    }
                }
                binding->expression = bind->second.get<std::string>();
                instance->propertyValues[key] = Value::binding(binding);
            } else {
                std::cerr << "error: malformed binding in object id=" << id << ", class=" << typeName
                          << ", property=" << key << std::endl;
                return false;
            }
        }
    }

    // Recursively traverse the children..
    auto childrenIt = object.find("children");
    if (childrenIt != object.end()) {
        const picojson::value &children = childrenIt->second;
        if (children.is<picojson::array>()) {
            for (auto child : children.get<picojson::array>())
                if (!buildObject(child, instance, clazz))
                    return false;
        } else if (children.is<picojson::object>()) {
            if (!buildObject(children, instance, clazz))
                return false;
        } else {
            std::cerr << "error: object id=" << id << " of class=" << typeName << ", has invalid children, must be JSON array or object" << std::endl;
            return false;
        }
    }

    if (m_verbose) {
        std::string padding;
        Object *p = parent;
        while (p) {
            padding += "  ";
            p = p->parent;
        }
        std::cerr << " - object: " << padding << "id=" << id << ", class=" << typeName << ", children=" << instance->children.size() << std::endl;
    }

    if (parent)
        parent->children.push_back(instance);
    else
        clazz->root = instance;

    return true;
}